

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_etc.cpp
# Opt level: O3

uint64_t __thiscall
basisu::etc_block::evaluate_etc1_error
          (etc_block *this,color_rgba *pBlock_pixels,bool perceptual,int subblock_index)

{
  uint64_t uVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  color_rgba unpacked_block [16];
  anon_union_4_2_6eba8969_for_color_rgba_0 local_68 [18];
  
  unpack_etc1(this,(color_rgba *)&local_68[0].field_1,false);
  if (subblock_index < 0) {
    lVar2 = 0;
    uVar1 = 0;
    do {
      if (perceptual) {
        iVar3 = (uint)pBlock_pixels[lVar2].field_0.m_comps[0] - (uint)local_68[lVar2].field_1.r;
        iVar6 = (uint)pBlock_pixels[lVar2].field_0.m_comps[2] - (uint)local_68[lVar2].field_1.b;
        iVar8 = iVar6 * 9 + iVar3 * 0x1b +
                ((uint)pBlock_pixels[lVar2].field_0.m_comps[1] - (uint)local_68[lVar2].field_1.g) *
                0x5c;
        lVar4 = (long)(iVar3 * 0x80 - iVar8);
        lVar5 = (long)(iVar6 * 0x80 - iVar8);
        uVar7 = ((uint)((int)((ulong)(lVar5 * lVar5) >> 7) * 3) >> 7) +
                (int)((ulong)((long)iVar8 * (long)iVar8) >> 7) +
                ((uint)((int)((ulong)(lVar4 * lVar4) >> 7) * 0x1a) >> 7);
      }
      else {
        iVar6 = (uint)pBlock_pixels[lVar2].field_0.m_comps[1] - (uint)local_68[lVar2].field_1.g;
        iVar8 = (uint)pBlock_pixels[lVar2].field_0.m_comps[2] - (uint)local_68[lVar2].field_1.b;
        iVar3 = (uint)pBlock_pixels[lVar2].field_0.m_comps[0] - (uint)local_68[lVar2].field_1.r;
        uVar7 = iVar8 * iVar8 + iVar6 * iVar6 + iVar3 * iVar3;
      }
      uVar1 = uVar1 + uVar7;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x10);
  }
  else {
    lVar2 = 0;
    uVar1 = 0;
    do {
      uVar7 = *(uint *)(g_etc1_pixel_indices +
                       lVar2 * 4 +
                       (ulong)(uint)subblock_index * 0x20 +
                       (ulong)(((this->field_0).m_bytes[3] & 1) << 6));
      if (perceptual) {
        iVar3 = (uint)pBlock_pixels[uVar7].field_0.m_comps[0] - (uint)local_68[uVar7].field_1.r;
        iVar6 = (uint)pBlock_pixels[uVar7].field_0.m_comps[2] - (uint)local_68[uVar7].field_1.b;
        iVar8 = iVar6 * 9 + iVar3 * 0x1b +
                ((uint)pBlock_pixels[uVar7].field_0.m_comps[1] - (uint)local_68[uVar7].field_1.g) *
                0x5c;
        lVar4 = (long)(iVar3 * 0x80 - iVar8);
        lVar5 = (long)(iVar6 * 0x80 - iVar8);
        uVar7 = (uint)((int)((ulong)(lVar4 * lVar4) >> 7) * 0x1a) >> 7;
        iVar6 = ((uint)((int)((ulong)(lVar5 * lVar5) >> 7) * 3) >> 7) +
                (int)((ulong)((long)iVar8 * (long)iVar8) >> 7);
      }
      else {
        iVar8 = (uint)pBlock_pixels[uVar7].field_0.m_comps[1] - (uint)local_68[uVar7].field_1.g;
        iVar6 = (uint)pBlock_pixels[uVar7].field_0.m_comps[2] - (uint)local_68[uVar7].field_1.b;
        iVar3 = (uint)pBlock_pixels[uVar7].field_0.m_comps[0] - (uint)local_68[uVar7].field_1.r;
        uVar7 = iVar8 * iVar8 + iVar3 * iVar3;
        iVar6 = iVar6 * iVar6;
      }
      uVar1 = uVar1 + (iVar6 + uVar7);
      lVar2 = lVar2 + 1;
    } while (lVar2 != 8);
  }
  return uVar1;
}

Assistant:

uint64_t etc_block::evaluate_etc1_error(const color_rgba* pBlock_pixels, bool perceptual, int subblock_index) const
	{
		color_rgba unpacked_block[16];

		unpack_etc1(*this, unpacked_block);

		uint64_t total_error = 0;

		if (subblock_index < 0)
		{
			for (uint32_t i = 0; i < 16; i++)
				total_error += color_distance(perceptual, pBlock_pixels[i], unpacked_block[i], false);
		}
		else
		{
			const bool flip_bit = get_flip_bit();

			for (uint32_t i = 0; i < 8; i++)
			{
				const uint32_t idx = g_etc1_pixel_indices[flip_bit][subblock_index][i];

				total_error += color_distance(perceptual, pBlock_pixels[idx], unpacked_block[idx], false);
			}
		}

		return total_error;
	}